

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

int __thiscall helics::BrokerBase::parseArgs(BrokerBase *this,string_view initializationString)

{
  ConfigType CVar1;
  ParseOutput PVar2;
  char *__s;
  size_type __len2;
  shared_ptr<helics::helicsCLI11App> sVar3;
  shared_ptr<helics::helicsCLI11App> sApp;
  shared_ptr<helics::helicsCLI11App> app;
  string local_80;
  App_p local_60;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 local_40 [16];
  
  __s = initializationString._M_str;
  __len2 = initializationString._M_len;
  CVar1 = fileops::getConfigType(initializationString);
  switch(CVar1) {
  case JSON_STRING:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + __len2);
    loadInfoFromJson(this,&local_80,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    PVar2 = OK;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&this->configString,0,(this->configString)._M_string_length,__s,__len2);
    break;
  case JSON_FILE:
    this->fileInUse = true;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + __len2);
    loadInfoFromJson(this,&local_80,true);
    goto LAB_002e9f13;
  case TOML_STRING:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + __len2);
    loadInfoFromToml(this,&local_80,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    PVar2 = OK;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&this->configString,0,(this->configString)._M_string_length,__s,__len2);
    break;
  case TOML_FILE:
    this->fileInUse = true;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + __len2);
    loadInfoFromToml(this,&local_80,true);
LAB_002e9f13:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    PVar2 = OK;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&this->configString,0,(this->configString)._M_string_length,__s,__len2);
    break;
  default:
    sVar3 = generateBaseCLI((BrokerBase *)local_40);
    (*this->_vptr_BrokerBase[8])
              (&local_50,this,
               sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
    local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_48;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_48->_M_use_count = local_48->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_48->_M_use_count = local_48->_M_use_count + 1;
      }
    }
    CLI::App::add_subcommand((App *)local_40._0_8_,&local_60);
    if (local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + __len2);
    PVar2 = helicsCLI11App::helics_parse<std::__cxx11::string>
                      ((helicsCLI11App *)local_40._0_8_,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
    }
  }
  return PVar2;
}

Assistant:

int BrokerBase::parseArgs(std::string_view initializationString)
{
    auto type = fileops::getConfigType(initializationString);

    switch (type) {
        case fileops::ConfigType::JSON_FILE:
            fileInUse = true;
            loadInfoFromJson(std::string(initializationString));
            configString = initializationString;
            return 0;
        case fileops::ConfigType::JSON_STRING:
            try {
                loadInfoFromJson(std::string(initializationString));
                configString = initializationString;
                return 0;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeConfigToml(initializationString)) {
                    try {
                        loadInfoFromToml(std::string(initializationString));
                        configString = initializationString;
                        return 0;
                    }
                    catch (const helics::InvalidParameter&) {
                        if (fileops::looksLikeCommandLine(initializationString)) {
                            break;
                        }
                        throw;
                    }
                }
                throw;
            }
            break;
        case fileops::ConfigType::TOML_FILE:
            fileInUse = true;
            loadInfoFromToml(std::string(initializationString));
            configString = initializationString;
            return 0;
        case fileops::ConfigType::TOML_STRING:
            try {
                loadInfoFromToml(std::string(initializationString));
                configString = initializationString;
                return 0;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeCommandLine(configString)) {
                    break;
                }
                throw;
            }
            break;
        case fileops::ConfigType::CMD_LINE:
        case fileops::ConfigType::NONE:
            // with NONE there are default command line and environment possibilities
            break;
    }

    auto app = generateBaseCLI();
    auto sApp = generateCLI();
    app->add_subcommand(sApp);
    auto res = app->helics_parse(std::string(initializationString));
    return static_cast<int>(res);
}